

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

AdamOptimizer * __thiscall
CoreML::Specification::AdamOptimizer::New(AdamOptimizer *this,Arena *arena)

{
  AdamOptimizer *this_00;
  
  this_00 = (AdamOptimizer *)operator_new(0x40);
  AdamOptimizer(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::AdamOptimizer>(arena,this_00);
  }
  return this_00;
}

Assistant:

AdamOptimizer* AdamOptimizer::New(::google::protobuf::Arena* arena) const {
  AdamOptimizer* n = new AdamOptimizer;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}